

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6.c
# Opt level: O2

int lrtr_ipv6_str_to_addr(char *a,lrtr_ipv6_addr *ip)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  lrtr_ipv4_addr addr4;
  uint16_t words [8];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = -1;
  if (*a == ':') {
    if (a[1] != ':') {
LAB_00103ada:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return iVar10;
    }
    a = a + 1;
  }
  uVar11 = 0;
  uVar3 = 0xffffffff;
  pbVar8 = (byte *)a;
LAB_00103995:
  while( true ) {
    pbVar8 = pbVar8 + 1;
    bVar1 = *a;
    iVar7 = (int)uVar3;
    if (bVar1 != 0x3a) {
      if (bVar1 != 0) {
        iVar5 = 0;
        uVar6 = 0;
        do {
          if ((byte)(bVar1 - 0x30) < 10) {
            uVar9 = (uint)(byte)(bVar1 - 0x30);
          }
          else {
            uVar9 = (uint)bVar1;
            if ((byte)(bVar1 + 0xbf) < 6) {
              uVar9 = uVar9 - 0x37;
            }
            else {
              if (5 < (byte)(bVar1 + 0x9f)) goto LAB_00103a13;
              uVar9 = uVar9 - 0x57;
            }
          }
          iVar5 = iVar5 * 0x10 + uVar9;
          if ((0xffff < iVar5) || (3 < uVar6)) goto LAB_00103ada;
          uVar6 = uVar6 + 1;
          bVar1 = *pbVar8;
          pbVar8 = pbVar8 + 1;
        } while( true );
      }
      goto LAB_00103a87;
    }
    if (-1 < iVar7) break;
    a = (char *)((byte *)a + 1);
    uVar3 = uVar11 & 0xffffffff;
  }
  goto LAB_00103ada;
LAB_00103a13:
  if (bVar1 == 0) {
    a = (char *)(pbVar8 + -1);
  }
  else {
    if (uVar9 != 0x3a) {
      if ((uVar9 == 0x2e) &&
         (((uVar11 == 6 || (-1 < iVar7 && uVar11 < 6)) &&
          (iVar5 = lrtr_ipv4_str_to_addr(a,&addr4), iVar5 != -1)))) {
        *(uint32_t *)(words + uVar11) = addr4.addr >> 0x10 | addr4.addr << 0x10;
        uVar11 = (ulong)((int)uVar11 + 2);
LAB_00103a87:
        if (-1 < iVar7) {
          uVar6 = (uint)uVar11;
          uVar3 = 7;
          while (uVar6 = uVar6 - 1, iVar7 <= (int)uVar6) {
            words[uVar3] = words[uVar6];
            uVar3 = uVar3 - 1;
          }
          for (; iVar7 <= (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
            words[uVar3 & 0xffffffff] = 0;
          }
        }
        iVar10 = 0;
        for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
          ip->addr[lVar4] = (uint)words[lVar4 * 2 + 1] | *(int *)(words + lVar4 * 2) << 0x10;
        }
      }
      goto LAB_00103ada;
    }
    a = (char *)pbVar8;
    if (*pbVar8 == 0) goto LAB_00103ada;
  }
  if (uVar11 == 8) goto LAB_00103ada;
  words[uVar11] = (uint16_t)iVar5;
  uVar11 = uVar11 + 1;
  pbVar8 = (byte *)a;
  goto LAB_00103995;
}

Assistant:

int lrtr_ipv6_str_to_addr(const char *a, struct lrtr_ipv6_addr *ip)
{
	uint32_t *o = ip->addr;
	uint16_t words[8];
	int i, j, k, l, hfil;
	const char *start;

	if (a[0] == ':') { /* Leading :: */
		if (a[1] != ':')
			return -1;
		a++;
	}
	hfil = -1;
	i = 0;
	while (*a) {
		if (*a == ':') { /* :: */
			if (hfil >= 0)
				return -1;
			hfil = i;
			a++;
			continue;
		}
		j = 0;
		l = 0;
		start = a;
		for (;;) {
			if (*a >= '0' && *a <= '9')
				k = *a++ - '0';
			else if (*a >= 'A' && *a <= 'F')
				k = *a++ - 'A' + 10;
			else if (*a >= 'a' && *a <= 'f')
				k = *a++ - 'a' + 10;
			else
				break;
			j = (j << 4) + k;
			if (j >= 0x10000 || ++l > 4)
				return -1;
		}
		if (*a == ':' && a[1]) {
			a++;
		} else if (*a == '.' && (i == 6 || (i < 6 && hfil >= 0))) { /* Embedded IPv4 address */
			struct lrtr_ipv4_addr addr4;

			if (lrtr_ipv4_str_to_addr(start, &addr4) == -1)
				return -1;
			words[i++] = addr4.addr >> 16;
			words[i++] = addr4.addr;
			break;
		} else if (*a) {
			return -1;
		}
		if (i >= 8)
			return -1;
		words[i++] = j;
	}

	/* Replace :: with an appropriate quantity of zeros */
	if (hfil >= 0) {
		j = 8 - i;
		for (i = 7; i - j >= hfil; i--)
			words[i] = words[i - j];
		for (; i >= hfil; i--)
			words[i] = 0;
	}

	/* Convert the address to lrtr_ip_addr format */
	for (i = 0; i < 4; i++)
		o[i] = (words[2 * i] << 16) | words[2 * i + 1];
	return 0;
}